

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

Builder capnp::DynamicValue::Builder::AsImpl<capnp::Data,_(capnp::Kind)1>::apply(Builder *builder)

{
  ArrayPtr<unsigned_char> AVar1;
  Fault local_38;
  Fault f;
  Builder *builder_local;
  char *pcStack_10;
  
  if (builder->type == TEXT) {
    _f = Text::Builder::asBytes(&(builder->field_1).textValue);
    Data::Builder::Builder((Builder *)&builder_local,_f);
  }
  else if (builder->type == DATA) {
    builder_local = (Builder *)(builder->field_1).anyPointerValue.builder.segment;
    pcStack_10 = (builder->field_1).textValue.content.ptr;
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
              (&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x740,FAILED,"builder.type == DATA","\"Value type mismatch.\"",
               (char (*) [21])"Value type mismatch.");
    builder_local = (Builder *)0x0;
    pcStack_10 = (char *)0x0;
    Data::Builder::Builder((Builder *)&builder_local);
    kj::_::Debug::Fault::~Fault(&local_38);
  }
  AVar1.size_ = (size_t)pcStack_10;
  AVar1.ptr = (uchar *)builder_local;
  return (Builder)AVar1;
}

Assistant:

Data::Builder DynamicValue::Builder::AsImpl<Data>::apply(Builder& builder) {
  if (builder.type == TEXT) {
    // Coerce text to data.
    return builder.textValue.asBytes();
  }
  KJ_REQUIRE(builder.type == DATA, "Value type mismatch.") {
    return BuilderFor<Data>();
  }
  return builder.dataValue;
}